

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat3 * dja::mat3::rotation(quaternion *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  mat3 *in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar1 = (q->im).y;
  fVar5 = fVar1 * (fVar1 + fVar1);
  fVar2 = (q->im).x;
  fVar7 = fVar2 + fVar2;
  fVar3 = (q->im).z;
  fVar4 = (fVar1 + fVar1) * fVar3;
  fVar9 = (fVar3 + fVar3) * fVar3;
  fVar6 = q->re + q->re;
  fVar8 = 1.0 - fVar7 * fVar2;
  in_RDI->m[0].x = 0.0;
  in_RDI->m[0].y = 0.0;
  *(undefined8 *)&in_RDI->m[0].z = 0;
  in_RDI->m[1].y = 0.0;
  in_RDI->m[1].z = 0.0;
  in_RDI->m[2].x = 0.0;
  in_RDI->m[2].y = 0.0;
  in_RDI->m[0].x = (1.0 - fVar5) - fVar9;
  in_RDI->m[0].y = fVar1 * fVar7 + fVar3 * fVar6;
  in_RDI->m[0].z = fVar7 * fVar3 - fVar1 * fVar6;
  in_RDI->m[1].x = fVar1 * fVar7 - fVar3 * fVar6;
  in_RDI->m[1].y = fVar8 - fVar9;
  in_RDI->m[1].z = fVar4 + fVar6 * fVar2;
  in_RDI->m[2].x = fVar1 * fVar6 + fVar7 * fVar3;
  in_RDI->m[2].y = fVar4 - fVar6 * fVar2;
  in_RDI->m[2].z = fVar8 - fVar5;
  return in_RDI;
}

Assistant:

mat3 mat3::rotation(const quaternion& q)
{
    float_t jj2 = float_t(2) * q[2] * q[2];
    float_t ij2 = float_t(2) * q[1] * q[2];
    float_t ik2 = float_t(2) * q[1] * q[3];
    float_t jk2 = float_t(2) * q[2] * q[3];
    float_t kk2 = float_t(2) * q[3] * q[3];
    float_t rk2 = float_t(2) * q[0] * q[3];
    float_t rj2 = float_t(2) * q[0] * q[2];
    float_t ri2 = float_t(2) * q[0] * q[1];
    float_t ii2 = float_t(2) * q[1] * q[1];

    return mat3(float_t(1) - jj2 - kk2, ij2 + rk2, ik2 - rj2,
                ij2 - rk2, float_t(1) - ii2 - kk2, jk2 + ri2,
                ik2 + rj2, jk2 - ri2, float_t(1) - ii2 - jj2);
}